

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-list.c
# Opt level: O0

uint8_t monster_list_entry_line_color(monster_list_entry_t *entry)

{
  _Bool _Var1;
  monster_list_entry_t *entry_local;
  
  _Var1 = flag_has_dbg(entry->race->flags,0xc,1,"entry->race->flags","RF_UNIQUE");
  if (_Var1) {
    entry_local._7_1_ = '\x11';
  }
  else if ((int)player->depth < entry->race->level) {
    entry_local._7_1_ = '\x04';
  }
  else {
    entry_local._7_1_ = '\x01';
  }
  return entry_local._7_1_;
}

Assistant:

uint8_t monster_list_entry_line_color(const monster_list_entry_t *entry)
{
	/* Display uniques in a special colour */
	if (rf_has(entry->race->flags, RF_UNIQUE))
		return COLOUR_VIOLET;
	else if (entry->race->level > player->depth)
		return COLOUR_RED;
	else
		return COLOUR_WHITE;
}